

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDeformer.cpp
# Opt level: O2

void __thiscall Assimp::FBX::BlendShapeChannel::~BlendShapeChannel(BlendShapeChannel *this)

{
  (this->super_Deformer).super_Object._vptr_Object = (_func_int **)&PTR__BlendShapeChannel_00821d38;
  std::
  _Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
  ::~_Vector_base(&(this->shapeGeometries).
                   super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                 );
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->fullWeights).super__Vector_base<float,_std::allocator<float>_>);
  Deformer::~Deformer(&this->super_Deformer);
  return;
}

Assistant:

BlendShapeChannel::~BlendShapeChannel()
{

}